

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall
BCLog::Logger::FormatLogStrInPlace
          (Logger *this,string *str,LogFlags category,Level level,string_view source_file,
          int source_line,string_view logging_function,string_view threadname,time_point now,
          seconds mocktime)

{
  undefined4 in_register_0000000c;
  basic_string_view<char,_std::char_traits<char>_> *args;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  long in_FS_OFFSET;
  string_view prefix;
  string_view local_68;
  string local_50;
  long local_30;
  
  args = (basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(in_register_0000000c,level);
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)source_file._M_str;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetLogPrefix_abi_cxx11_(&local_50,this,category,level);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (str,0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->m_log_sourcelocations == true) {
    prefix._M_str = "./";
    prefix._M_len = 2;
    local_68 = util::RemovePrefixView(source_file,prefix);
    args = (basic_string_view<char,_std::char_traits<char>_> *)&source_line;
    tinyformat::
    format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>>
              (&local_50,(tinyformat *)"[%s:%d] [%s] ",(char *)&local_68,args,
               (int *)&logging_function,args_2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (str,0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (this->m_log_threadnames == true) {
    if (threadname._M_len == 0) {
      local_68._M_str = "unknown";
      local_68._M_len = 7;
    }
    else {
      local_68 = threadname;
    }
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
              (&local_50,(tinyformat *)0x7356ff,(char *)&local_68,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (str,0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  LogTimestampStr_abi_cxx11_(&local_50,this,now,mocktime);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
            (str,0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::FormatLogStrInPlace(std::string& str, BCLog::LogFlags category, BCLog::Level level, std::string_view source_file, int source_line, std::string_view logging_function, std::string_view threadname, SystemClock::time_point now, std::chrono::seconds mocktime) const
{
    str.insert(0, GetLogPrefix(category, level));

    if (m_log_sourcelocations) {
        str.insert(0, strprintf("[%s:%d] [%s] ", RemovePrefixView(source_file, "./"), source_line, logging_function));
    }

    if (m_log_threadnames) {
        str.insert(0, strprintf("[%s] ", (threadname.empty() ? "unknown" : threadname)));
    }

    str.insert(0, LogTimestampStr(now, mocktime));
}